

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::
emplaceRealloc<(anonymous_namespace)::Constructable>
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,pointer pos,
          Constructable *args)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  pointer pCVar4;
  uint *puVar5;
  ulong uVar6;
  pointer ctx;
  int iVar7;
  pointer pCVar8;
  pointer pCVar9;
  long lVar10;
  
  if (this->len != 0xfffffffffffffff) {
    uVar6 = this->len + 1;
    uVar1 = this->cap;
    if (uVar6 < uVar1 * 2) {
      uVar6 = uVar1 * 2;
    }
    if (0xfffffffffffffff - uVar1 < uVar1) {
      uVar6 = 0xfffffffffffffff;
    }
    lVar10 = (long)pos - (long)this->data_;
    pCVar4 = (pointer)operator_new(uVar6 * 8);
    *(undefined1 *)((long)pCVar4 + lVar10) = 1;
    *(int *)((long)pCVar4 + lVar10 + 4) = args->value;
    args->value = 0;
    iVar2 = (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    iVar7 = (anonymous_namespace)::Constructable::numMoveConstructorCalls + 1;
    ctx = this->data_;
    pCVar8 = ctx + this->len;
    if (pCVar8 == pos) {
      if (this->len != 0) {
        iVar7 = -1;
        pCVar8 = pCVar4;
        do {
          pCVar8->constructed = true;
          pCVar8->value = ctx->value;
          ctx->value = 0;
          ctx = ctx + 1;
          pCVar8 = pCVar8 + 1;
          iVar7 = iVar7 + -1;
        } while (ctx != pos);
        iVar2 = (anonymous_namespace)::Constructable::numConstructorCalls - iVar7;
        iVar7 = (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar7;
      }
    }
    else {
      if (ctx != pos) {
        iVar7 = -1;
        pCVar9 = pCVar4;
        do {
          pCVar9->constructed = true;
          pCVar9->value = ctx->value;
          ctx->value = 0;
          ctx = ctx + 1;
          pCVar9 = pCVar9 + 1;
          iVar7 = iVar7 + -1;
        } while (ctx != pos);
        iVar2 = (anonymous_namespace)::Constructable::numConstructorCalls - iVar7;
        iVar7 = (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar7;
      }
      puVar5 = (uint *)((long)pCVar4 + lVar10 + 0xc);
      iVar3 = 0;
      do {
        *(undefined1 *)(puVar5 + -1) = 1;
        ctx = (pointer)(ulong)(uint)pos->value;
        *puVar5 = pos->value;
        pos->value = 0;
        pos = pos + 1;
        puVar5 = puVar5 + 2;
        iVar3 = iVar3 + -1;
      } while (pos != pCVar8);
      iVar2 = iVar2 - iVar3;
      iVar7 = iVar7 - iVar3;
    }
    (anonymous_namespace)::Constructable::numMoveConstructorCalls = iVar7;
    (anonymous_namespace)::Constructable::numConstructorCalls = iVar2;
    cleanup(this,(EVP_PKEY_CTX *)ctx);
    this->len = this->len + 1;
    this->cap = uVar6;
    this->data_ = pCVar4;
    return (pointer)((long)pCVar4 + lVar10);
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}